

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# numparse_compositions.h
# Opt level: O3

void __thiscall
icu_63::numparse::impl::ArraySeriesMatcher::~ArraySeriesMatcher(ArraySeriesMatcher *this)

{
  (this->super_SeriesMatcher).super_CompositionMatcher.super_NumberParseMatcher.
  _vptr_NumberParseMatcher = (_func_int **)&PTR__ArraySeriesMatcher_0047c008;
  MaybeStackArray<const_icu_63::numparse::impl::NumberParseMatcher_*,_3>::~MaybeStackArray
            (&this->fMatchers);
  NumberParseMatcher::~NumberParseMatcher((NumberParseMatcher *)this);
  operator_delete(this);
  return;
}

Assistant:

class U_I18N_API ArraySeriesMatcher : public SeriesMatcher {
  public:
    ArraySeriesMatcher();  // WARNING: Leaves the object in an unusable state

    typedef MaybeStackArray<const NumberParseMatcher*, 3> MatcherArray;

    /** The array is std::move'd */
    ArraySeriesMatcher(MatcherArray& matchers, int32_t matchersLen);

    UnicodeString toString() const override;

    int32_t length() const override;

  protected:
    const NumberParseMatcher* const* begin() const override;

    const NumberParseMatcher* const* end() const override;

  private:
    MatcherArray fMatchers;
    int32_t fMatchersLen;
}